

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmem_allocator.h
# Opt level: O1

void __thiscall
cppcms::impl::
shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>
::free(shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>
       *this,void *__ptr)

{
  mutex *this_00;
  long lVar1;
  
  lVar1 = process_settings::process_memory;
  this_00 = (mutex *)(process_settings::process_memory + 8);
  mutex::lock(this_00);
  if (__ptr != (void *)0x0) {
    buddy_allocator::free_page(*(buddy_allocator **)(lVar1 + 0x50),(page *)((long)__ptr + -0x10));
  }
  mutex::unlock(this_00);
  return;
}

Assistant:

void free(void *p) const
	{
		return mm->free(p);
	}